

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float _v [4];
  float _v_00 [4];
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  long in_RCX;
  Mat *in_RSI;
  long *in_RDI;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_1;
  Mat borderm_1;
  int z;
  __m128 pad_value_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m;
  __m128 pad_value_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  __m128 pad_value_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  __m128 pad_value;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  Mat *pMVar12;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  undefined1 *puVar13;
  int in_stack_fffffffffffffbc8;
  float fVar14;
  float in_stack_fffffffffffffbcc;
  float fVar15;
  undefined4 in_stack_fffffffffffffbd0;
  float fVar16;
  int in_stack_fffffffffffffbd4;
  float _c;
  Mat *in_stack_fffffffffffffbd8;
  Allocator *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  Mat *pMVar17;
  Mat *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Mat *in_stack_fffffffffffffc40;
  Mat *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  Mat *in_stack_fffffffffffffcf8;
  Mat *in_stack_fffffffffffffd00;
  undefined1 local_2c0 [148];
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  Mat *local_1a8;
  Mat *pMStack_1a0;
  Option *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe80;
  Padding *in_stack_fffffffffffffe88;
  int local_148;
  Option *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Padding_x86 *in_stack_ffffffffffffff08;
  int local_8c;
  
  if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0)) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0)) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0 &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)))) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == 0)) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0);
    local_8c = 0;
  }
  else {
    iVar8 = ncnn::Mat::elembits(in_RSI);
    if (iVar8 == 8) {
      local_8c = forward_int8(in_stack_ffffffffffffff08,
                              (Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              in_stack_fffffffffffffef0);
    }
    else {
      iVar8 = in_RSI->d;
      iVar2 = in_RSI->c;
      iVar3 = in_RSI->dims;
      iVar4 = in_RSI->elempack;
      if (iVar4 == 4) {
        if (iVar3 == 1) {
          iVar9 = 1;
          if ((in_RSI->w * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) % 4 == 0) {
            iVar9 = 4;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 4 == 0) && (iVar9 == 4)
              ) && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                              (int)in_stack_fffffffffffffbcc,
                              CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                              in_stack_fffffffffffffbbc,(Allocator *)in_stack_fffffffffffffbb0);
            bVar7 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
            if (!bVar7) {
              v[1] = (float)in_stack_fffffffffffffbd4;
              v[0] = (float)in_stack_fffffffffffffbd0;
              v._8_8_ = in_stack_fffffffffffffbd8;
              padding_constant_pack4_sse
                        (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                         (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                         (int)in_stack_fffffffffffffbf0,
                         (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                         (int)in_stack_fffffffffffffbe8,v);
              return 0;
            }
            return -100;
          }
        }
        if (iVar3 == 2) {
          iVar9 = 1;
          if ((in_RSI->h * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)) % 4 == 0) {
            iVar9 = 4;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) && (iVar9 == 4)
              ) && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                              (int)in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8,
                              CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                              in_stack_fffffffffffffbbc,(Allocator *)in_stack_fffffffffffffbb0);
            bVar7 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
            if (!bVar7) {
              v_00[1] = (float)in_stack_fffffffffffffbd4;
              v_00[0] = (float)in_stack_fffffffffffffbd0;
              v_00._8_8_ = in_stack_fffffffffffffbd8;
              padding_constant_pack4_sse
                        (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                         (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                         (int)in_stack_fffffffffffffbf0,
                         (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                         (int)in_stack_fffffffffffffbe8,v_00);
              return 0;
            }
            return -100;
          }
        }
        if (iVar3 == 3) {
          iVar9 = iVar2 * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          iVar10 = 1;
          if (iVar9 % 4 == 0) {
            iVar10 = 4;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 4 == 0) &&
              (iVar10 == 4)) &&
             ((iVar9 == iVar2 * 4 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
            ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                              (int)in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8,
                              in_stack_fffffffffffffbc4,
                              CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                              (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                              in_stack_fffffffffffffbe0);
            bVar7 = ncnn::Mat::empty(in_stack_fffffffffffffbb0);
            if (!bVar7) {
              iVar8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / 4;
              for (local_148 = 0; local_148 < iVar9 / 4; local_148 = local_148 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  uVar1 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  in_stack_fffffffffffffbd8 = (Mat *)CONCAT44(uVar1,uVar1);
                  pMVar12 = (Mat *)CONCAT44(uVar1,uVar1);
                  pMVar17 = in_stack_fffffffffffffbd8;
                }
                else {
                  pfVar11 = ncnn::Mat::operator_cast_to_float_
                                      ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
                  in_stack_fffffffffffffbf8 = *(Mat **)(pfVar11 + (local_148 << 2));
                  pMVar12 = *(Mat **)(pfVar11 + (local_148 << 2) + 2);
                  pMVar17 = in_stack_fffffffffffffbf8;
                  in_stack_fffffffffffffc00 = pMVar12;
                }
                local_1a8 = pMVar17;
                pMStack_1a0 = pMVar12;
                if ((local_148 - iVar8 < 0) || (iVar2 <= local_148 - iVar8)) {
                  _v[1] = (float)in_stack_fffffffffffffbc4;
                  _v[0] = (float)in_stack_fffffffffffffbc0;
                  _v[2] = (float)in_stack_fffffffffffffbc8;
                  _v[3] = in_stack_fffffffffffffbcc;
                  ncnn::Mat::fill<float__vector(4)>
                            ((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),_v
                            );
                }
                else {
                  ncnn::Mat::channel(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                    v_01[1] = (float)in_stack_fffffffffffffbd4;
                    v_01[0] = (float)in_stack_fffffffffffffbd0;
                    v_01._8_8_ = in_stack_fffffffffffffbd8;
                    padding_constant_pack4_sse
                              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                               (int)((ulong)pMVar12 >> 0x20),(int)pMVar12,
                               (int)((ulong)pMVar17 >> 0x20),(int)pMVar17,v_01);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                    padding_replicate_pack4_sse
                              (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                               (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                               (int)in_stack_fffffffffffffc38,
                               (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                               (int)in_stack_fffffffffffffc30);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                    padding_reflect_pack4_sse
                              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                               in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0,
                               in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
                  }
                  ncnn::Mat::~Mat((Mat *)0x691c73);
                }
                ncnn::Mat::~Mat((Mat *)0x691c80);
              }
              return 0;
            }
            return -100;
          }
        }
        if (iVar3 == 4) {
          local_204 = in_RSI->w + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_208 = in_RSI->h + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_20c = iVar8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
            pMVar12 = *(Mat **)(in_RCX + 8);
            ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                              (int)in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8,
                              in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0,
                              CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                              (int)in_stack_fffffffffffffbe0,(Allocator *)in_stack_fffffffffffffbe8)
            ;
            bVar7 = ncnn::Mat::empty(pMVar12);
            if (!bVar7) {
              for (local_210 = 0; local_210 < iVar2; local_210 = local_210 + 1) {
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  fVar14 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  fVar15 = fVar14;
                  fVar16 = fVar14;
                  _c = fVar14;
                }
                else {
                  pfVar11 = ncnn::Mat::operator_cast_to_float_
                                      ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
                  uVar5 = *(undefined8 *)(pfVar11 + (local_210 << 2));
                  uVar6 = *(undefined8 *)(pfVar11 + (local_210 << 2) + 2);
                  fVar14 = (float)uVar5;
                  fVar15 = (float)((ulong)uVar5 >> 0x20);
                  fVar16 = (float)uVar6;
                  _c = (float)((ulong)uVar6 >> 0x20);
                }
                local_228 = CONCAT44(fVar15,fVar14);
                uStack_220 = CONCAT44(_c,fVar16);
                for (local_22c = 0; local_22c < local_20c; local_22c = local_22c + 1) {
                  puVar13 = local_2c0;
                  ncnn::Mat::channel(in_stack_fffffffffffffbd8,(int)_c);
                  ncnn::Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffbbc,
                                                   in_stack_fffffffffffffbb8),
                                   (int)((ulong)pMVar12 >> 0x20));
                  ncnn::Mat::~Mat((Mat *)0x691f01);
                  if ((local_22c - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0)
                     || (iVar8 <= local_22c -
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8))) {
                    _v_00[2] = fVar14;
                    _v_00._0_8_ = puVar13;
                    _v_00[3] = fVar15;
                    ncnn::Mat::fill<float__vector(4)>((Mat *)CONCAT44(_c,fVar16),_v_00);
                  }
                  else {
                    ncnn::Mat::channel(in_stack_fffffffffffffbd8,(int)_c);
                    ncnn::Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8),
                                     (int)((ulong)pMVar12 >> 0x20));
                    ncnn::Mat::~Mat((Mat *)0x691ffc);
                    v_02[1] = _c;
                    v_02[0] = fVar16;
                    v_02._8_8_ = in_stack_fffffffffffffbd8;
                    padding_constant_pack4_sse
                              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                               (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                               (int)in_stack_fffffffffffffbf0,
                               (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                               (int)in_stack_fffffffffffffbe8,v_02);
                    ncnn::Mat::~Mat((Mat *)0x692052);
                  }
                  ncnn::Mat::~Mat((Mat *)0x6920a7);
                }
              }
              return 0;
            }
            return -100;
          }
        }
      }
      ncnn::Mat::Mat(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      if (iVar4 != 1) {
        convert_packing(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                        (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                        (Option *)in_stack_fffffffffffffbd8);
      }
      local_8c = Padding::forward(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      ncnn::Mat::~Mat((Mat *)0x6921fc);
    }
  }
  return local_8c;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}